

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O0

void __thiscall backend::Backend::do_mir_to_arm_transform(Backend *this)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  element_type *peVar4;
  Function *function;
  long *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_bool>
  pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  *v;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *__range1_1;
  Function arm_f;
  Codegen cg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *f;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range1;
  ArmCode code;
  Codegen *in_stack_00000b68;
  ArmCode *in_stack_fffffffffffff998;
  Codegen *in_stack_fffffffffffff9a0;
  Function *in_stack_fffffffffffff9a8;
  Function *in_stack_fffffffffffff9b0;
  Function *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  *in_stack_fffffffffffff9c0;
  Function *in_stack_fffffffffffff9c8;
  ostream *in_stack_fffffffffffff9d0;
  undefined7 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9df;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
  in_stack_fffffffffffff9e0;
  Timestamp *timestamp;
  undefined1 local_5c1 [40];
  allocator<char> local_599;
  string local_598 [48];
  Severity *in_stack_fffffffffffffa98;
  ostream *in_stack_fffffffffffffaa0;
  time_point_sys_clock local_520;
  Timestamp local_518 [3];
  undefined1 local_4c9;
  _Base_ptr local_4c8;
  undefined1 local_4c0;
  reference local_460;
  _Self local_458;
  _Self local_450;
  long local_448;
  reference local_188;
  _Self local_180;
  _Self local_178;
  long local_170;
  undefined1 local_168 [87];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [120];
  time_point_sys_clock local_70;
  Timestamp local_68;
  Timestamp local_40 [2];
  undefined1 local_9;
  
  local_9 = 2;
  AixLog::operator<<(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  timestamp = local_40;
  AixLog::Tag::Tag((Tag *)0x1d1898);
  poVar2 = AixLog::operator<<(in_stack_fffffffffffff9d0,(Tag *)in_stack_fffffffffffff9c8);
  local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_68,&local_70);
  AixLog::operator<<(poVar2,timestamp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e0._M_node,
             (char *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
             (allocator<char> *)in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e0._M_node,
             (char *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
             (allocator<char> *)in_stack_fffffffffffff9d0);
  AixLog::Function::Function
            (in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,
             (string *)in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998);
  poVar3 = AixLog::operator<<(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::operator<<(poVar3,"Doing  mir->arm  transform\n");
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff9a0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  AixLog::Timestamp::~Timestamp(&local_68);
  AixLog::Tag::~Tag((Tag *)0x1d19fc);
  memset(local_168,0,0x50);
  arm::ArmCode::ArmCode((ArmCode *)in_stack_fffffffffffff9a0);
  local_170 = *in_RDI + 8;
  local_178._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_fffffffffffff998);
  local_180._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              *)in_stack_fffffffffffff998);
  while (bVar1 = std::operator!=(&local_178,&local_180), bVar1) {
    local_188 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                             *)0x1d1a89);
    peVar4 = std::
             __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d1aa6);
    if ((peVar4->is_extern & 1U) == 0) {
      codegen::Codegen::Codegen
                ((Codegen *)cg.phi_reg._M_h._M_buckets,
                 (MirFunction *)cg.fixed_vars._M_h._M_single_bucket,
                 (MirPackage *)cg.fixed_vars._M_h._M_rehash_policy._M_next_resize,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  *)cg.fixed_vars._M_h._M_rehash_policy._0_8_,
                 cg.fixed_vars._M_h._M_element_count._7_1_);
      codegen::Codegen::translate_function(in_stack_00000b68);
      std::make_unique<arm::Function,arm::Function>(in_stack_fffffffffffff9a8);
      std::
      vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
                   *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
      std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::~unique_ptr
                ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                 in_stack_fffffffffffff9b0);
      arm::Function::~Function((Function *)in_stack_fffffffffffff9a0);
      codegen::Codegen::~Codegen(in_stack_fffffffffffff9a0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_fffffffffffff9a0);
  }
  local_448 = *in_RDI + 0x38;
  local_450._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                *)in_stack_fffffffffffff998);
  local_458._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
              *)in_stack_fffffffffffff998);
  while (bVar1 = std::operator!=(&local_450,&local_458), bVar1) {
    local_460 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                             *)0x1d1d53);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::pair<arm::ConstValue_&,_true>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (ConstValue *)in_stack_fffffffffffff9b0);
    pVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                      *)in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9e0 = pVar5.first._M_node;
    in_stack_fffffffffffff9df = pVar5.second;
    local_4c8 = in_stack_fffffffffffff9e0._M_node;
    local_4c0 = in_stack_fffffffffffff9df;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
             *)in_stack_fffffffffffff9a0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                  *)in_stack_fffffffffffff9a0);
  }
  std::optional<arm::ArmCode>::emplace<arm::ArmCode>
            ((optional<arm::ArmCode> *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  if ((*(byte *)(in_RDI[0xc] + 0x42) & 1) != 0) {
    local_4c9 = 2;
    poVar3 = AixLog::operator<<(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    AixLog::Tag::Tag((Tag *)0x1d1e5f);
    function = (Function *)AixLog::operator<<(poVar3,(Tag *)in_stack_fffffffffffff9c8);
    local_520.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_518,&local_520);
    AixLog::operator<<(poVar2,timestamp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e0._M_node,
               (char *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
               (allocator<char> *)poVar3);
    this_00 = (Function *)local_5c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e0._M_node,
               (char *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
               (allocator<char> *)poVar3);
    AixLog::Function::Function
              (this_00,(string *)in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0,
               (size_t)in_stack_fffffffffffff998);
    poVar2 = AixLog::operator<<(poVar3,function);
    std::operator<<(poVar2,"Code after transformation\n");
    AixLog::Function::~Function((Function *)in_stack_fffffffffffff9a0);
    std::__cxx11::string::~string((string *)(local_5c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5c1);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator(&local_599);
    AixLog::Timestamp::~Timestamp(local_518);
    AixLog::Tag::~Tag((Tag *)0x1d1fbc);
    in_stack_fffffffffffff9a0 =
         (Codegen *)
         std::optional<arm::ArmCode>::value((optional<arm::ArmCode> *)in_stack_fffffffffffff9a0);
    poVar2 = prelude::operator<<((ostream *)in_stack_fffffffffffff9a0,
                                 &in_stack_fffffffffffff998->super_Displayable);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  arm::ArmCode::~ArmCode((ArmCode *)in_stack_fffffffffffff9a0);
  return;
}

Assistant:

void Backend::do_mir_to_arm_transform() {
  LOG(INFO) << ("Doing  mir->arm  transform\n");
  auto code = arm::ArmCode();
  for (auto& f : package.functions) {
    if (f.second.type->is_extern) continue;
    auto cg = codegen::Codegen(f.second, package, extra_data,
                               options.allow_conditional_exec);
    auto arm_f = cg.translate_function();
    code.functions.push_back(std::make_unique<arm::Function>(std::move(arm_f)));
  }
  for (auto& v : package.global_values) {
    code.consts.insert({v.first, v.second});
  }
  arm_code.emplace(std::move(code));
  if (options.show_code_after_each_pass) {
    LOG(INFO) << ("Code after transformation\n");
    std::cout << arm_code.value() << std::endl;
  }
}